

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedCollator::RuleBasedCollator(RuleBasedCollator *this,CollationCacheEntry *entry)

{
  CollationTailoring *pCVar1;
  CollationSettings *pCVar2;
  
  Collator::Collator(&this->super_Collator);
  (this->super_Collator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedCollator_0039a780;
  pCVar1 = entry->tailoring;
  pCVar2 = pCVar1->settings;
  this->data = pCVar1->data;
  this->settings = pCVar2;
  this->tailoring = pCVar1;
  this->cacheEntry = entry;
  Locale::Locale(&this->validLocale,&entry->validLocale);
  this->explicitlySetAttributes = 0;
  this->actualLocaleIsSameAsValid = '\0';
  SharedObject::addRef(&this->settings->super_SharedObject);
  SharedObject::addRef(&this->cacheEntry->super_SharedObject);
  return;
}

Assistant:

RuleBasedCollator::RuleBasedCollator(const CollationCacheEntry *entry)
        : data(entry->tailoring->data),
          settings(entry->tailoring->settings),
          tailoring(entry->tailoring),
          cacheEntry(entry),
          validLocale(entry->validLocale),
          explicitlySetAttributes(0),
          actualLocaleIsSameAsValid(FALSE) {
    settings->addRef();
    cacheEntry->addRef();
}